

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_>::MultAdd
          (TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_> *this,
          TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble alpha,longdouble beta,int opt)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZDohrAssembleList<long_double> *this_00;
  longdouble *plVar4;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<long_double> *in_RSI;
  TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_> *in_RDI;
  int in_R8D;
  TPZStack<double,_10> *this_01;
  unkbyte10 in_stack_00000008;
  unkbyte10 in_stack_00000018;
  int64_t ic;
  int64_t xcols;
  int i;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> data;
  TPZFMatrix<long_double> *Residual_local;
  int isub;
  const_iterator it;
  TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> v2work;
  TPZAutoPointer<TPZDohrAssembleList<long_double>_> assemblelist;
  TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_> v1threaddata;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZFMatrix<long_double> v2;
  TPZFMatrix<long_double> v1;
  int64_t c;
  int64_t cols;
  int64_t rows;
  TPZSimpleTimer precondi;
  TPZFMatrix<long_double> *in_stack_000009d0;
  TPZFMatrix<long_double> *in_stack_000009d8;
  TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_> *in_stack_000009e0;
  undefined2 uVar5;
  undefined6 in_stack_fffffffffffffbc2;
  double in_stack_fffffffffffffbc8;
  TPZSimpleTimer *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined6 in_stack_fffffffffffffbe0;
  undefined2 in_stack_fffffffffffffbe6;
  TPZFMatrix<long_double> *in_stack_fffffffffffffbe8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffbf0;
  TPZAutoPointer<TPZFMatrix<long_double>_> *in_stack_fffffffffffffbf8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  TPZDohrAssembleList<long_double> *in_stack_fffffffffffffc10;
  undefined2 in_stack_fffffffffffffc18;
  undefined6 in_stack_fffffffffffffc1a;
  TPZFMatrix<long_double> *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  TPZMatrix<long_double> *in_stack_fffffffffffffc30;
  long local_348;
  int local_314;
  _Self local_2e0;
  _List_node_base *local_2d8;
  int local_2cc;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_> local_2c8 [10];
  undefined1 local_271;
  TPZAutoPointer<TPZDohrAssembleList<long_double>_> local_268;
  undefined1 *local_260;
  undefined1 local_250 [8];
  TPZFMatrix<long_double> *in_stack_fffffffffffffdb8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffdc0;
  vector<std::thread,_std::allocator<std::thread>_> local_230;
  longdouble local_218;
  longdouble local_178;
  TPZSimpleTimer *in_stack_fffffffffffffec0;
  long local_d8;
  list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
  *local_48;
  undefined2 uVar6;
  undefined6 in_stack_ffffffffffffffc2;
  TPZFMatrix<long_double> *x_00;
  undefined2 uVar7;
  undefined6 in_stack_ffffffffffffffd2;
  
  x_00 = (TPZFMatrix<long_double> *)in_stack_00000008;
  uVar7 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  local_48 = (list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
              *)in_stack_00000018;
  uVar5 = (undefined2)((unkuint10)in_stack_00000018 >> 0x40);
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) goto LAB_01f83147;
LAB_01f83179:
    TPZMatrix<long_double>::Error
              ((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8);
  }
  else {
LAB_01f83147:
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01f83179;
  }
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    iVar3 = TPZBaseMatrix::Cols(in_RCX);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
      iVar3 = TPZBaseMatrix::Rows(in_RDX);
      if (iVar2 == iVar3) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
        iVar3 = TPZBaseMatrix::Rows(in_RCX);
        if (iVar2 == iVar3) goto LAB_01f83265;
      }
    }
  }
  TPZMatrix<long_double>::Error((char *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8)
  ;
LAB_01f83265:
  TPZSimpleTimer::TPZSimpleTimer
            ((TPZSimpleTimer *)CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0));
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  uVar6 = uVar5;
  TPZMatrix<long_double>::PrepareZ
            (in_stack_fffffffffffffc30,
             (TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),in_stack_fffffffffffffc20
             ,(longdouble)CONCAT28(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0c);
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  local_178 = (longdouble)0;
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffffc20,CONCAT62(in_stack_fffffffffffffc1a,in_stack_fffffffffffffc18)
             ,(int64_t)in_stack_fffffffffffffc10,
             (longdouble *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  local_218 = (longdouble)0;
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffffc20,CONCAT62(in_stack_fffffffffffffc1a,in_stack_fffffffffffffc18)
             ,(int64_t)in_stack_fffffffffffffc10,
             (longdouble *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  if (in_RDI->fNumThreads < 1) {
    ComputeV1((TPZDohrPrecond<long_double,_TPZDohrSubstructCondense<long_double>_> *)
              CONCAT62(in_stack_ffffffffffffffd2,uVar7),x_00,
              (TPZFMatrix<long_double> *)CONCAT62(in_stack_ffffffffffffffc2,uVar6));
    ComputeV2(in_stack_000009e0,in_stack_000009d8,in_stack_000009d0);
  }
  else {
    std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1f8346d);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (allocator_type *)in_stack_fffffffffffffbd0);
    std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1f83499);
    TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_>::
    TPZDohrPrecondThreadV1Data
              ((TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_> *)
               local_250,in_RDI,in_RSI,(TPZFMatrix<long_double> *)&stack0xfffffffffffffe98);
    local_260 = local_250;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<long_double,TPZDohrSubstructCondense<long_double>>*,void>
              ((thread *)in_stack_fffffffffffffc00,
               (_func_void_ptr_void_ptr *)in_stack_fffffffffffffbf8,
               (TPZDohrPrecondThreadV1Data<long_double,_TPZDohrSubstructCondense<long_double>_> **)
               in_stack_fffffffffffffbf0);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_230,0);
    std::thread::operator=((thread *)CONCAT62(in_stack_fffffffffffffbc2,uVar5),(thread *)local_48);
    std::thread::~thread((thread *)0x1f8351e);
    operator_new(0xe0);
    local_271 = 1;
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
    ::size((list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
            *)CONCAT62(in_stack_fffffffffffffbc2,uVar5));
    TPZAutoPointer<TPZDohrAssembly<long_double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffbc2,uVar5),
               (TPZAutoPointer<TPZDohrAssembly<long_double>_> *)local_48);
    TPZDohrAssembleList<long_double>::TPZDohrAssembleList
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
               (TPZAutoPointer<TPZDohrAssembly<long_double>_> *)in_stack_fffffffffffffbf8);
    local_271 = 0;
    TPZAutoPointer<TPZDohrAssembleList<long_double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<long_double>_> *)
               CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
               (TPZDohrAssembleList<long_double> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    TPZAutoPointer<TPZDohrAssembly<long_double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembly<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffbc2,uVar5));
    TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::
    TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *)
               CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
               (TPZAutoPointer<TPZDohrAssembleList<long_double>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>::
    _List_const_iterator(local_2c8);
    local_2cc = 0;
    local_2d8 = (_List_node_base *)
                std::__cxx11::
                list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
                ::begin(local_48);
    local_2c8[0]._M_node = local_2d8;
    while( true ) {
      local_2e0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>_>
           ::end(local_48);
      bVar1 = std::operator!=(local_2c8,&local_2e0);
      if (!bVar1) break;
      operator_new(0x90);
      TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffbf0);
      TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator->(&in_RDI->fAssemble);
      TPZDohrAssembly<long_double>::Extract
                ((TPZDohrAssembly<long_double> *)in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc0c = local_2cc;
      in_stack_fffffffffffffc10 =
           (TPZDohrAssembleList<long_double> *)
           std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>::
           operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>
                      *)CONCAT62(in_stack_fffffffffffffbc2,uVar5));
      TPZAutoPointer<TPZFMatrix<long_double>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<long_double>_> *)
                 CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                 (TPZFMatrix<long_double> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
      TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *)
                 in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                 (TPZAutoPointer<TPZDohrSubstructCondense<long_double>_> *)in_stack_fffffffffffffc00
                 ,in_stack_fffffffffffffbf8);
      TPZAutoPointer<TPZFMatrix<long_double>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZFMatrix<long_double>_> *)
                 CONCAT62(in_stack_fffffffffffffbc2,uVar5));
      TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::AddItem
                ((TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *
                 )CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                 (TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
      ~TPZDohrPrecondV2SubData
                ((TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *)
                 CONCAT62(in_stack_fffffffffffffbc2,uVar5));
      std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>_>::operator++
                (local_2c8,0);
      local_2cc = local_2cc + 1;
    }
    for (local_314 = 0; local_314 < in_RDI->fNumThreads; local_314 = local_314 + 1) {
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<long_double,TPZDohrSubstructCondense<long_double>>*,void>
                ((thread *)in_stack_fffffffffffffc00,
                 (_func_void_ptr_void_ptr *)in_stack_fffffffffffffbf8,
                 (TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>
                  **)in_stack_fffffffffffffbf0);
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                (&local_230,(long)(local_314 + 2));
      std::thread::operator=((thread *)CONCAT62(in_stack_fffffffffffffbc2,uVar5),(thread *)local_48)
      ;
      std::thread::~thread((thread *)0x1f83922);
    }
    this_00 = TPZAutoPointer<TPZDohrAssembleList<long_double>_>::operator->(&local_268);
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<long_double>*,void>
              ((thread *)this_00,(_func_void_ptr_void_ptr *)in_stack_fffffffffffffbf8,
               (TPZDohrAssembleList<long_double> **)in_stack_fffffffffffffbf0);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_230,1);
    std::thread::operator=((thread *)CONCAT62(in_stack_fffffffffffffbc2,uVar5),(thread *)local_48);
    std::thread::~thread((thread *)0x1f839a6);
    for (local_314 = 0; local_314 < in_RDI->fNumThreads + 2; local_314 = local_314 + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_230,(long)local_314)
      ;
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::
    ~TPZDohrPrecondV2SubDataList
              ((TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffbc2,uVar5));
    TPZAutoPointer<TPZDohrAssembleList<long_double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleList<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffbc2,uVar5));
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffbd0);
  }
  TPZFMatrix<long_double>::operator+=
            ((TPZFMatrix<long_double> *)in_stack_fffffffffffffc10,
             (TPZMatrix<long_double> *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
            );
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  for (local_348 = 0; local_348 < iVar3; local_348 = local_348 + 1) {
    for (local_d8 = 0; local_d8 < iVar2; local_d8 = local_d8 + 1) {
      plVar4 = TPZFMatrix<long_double>::operator()
                         ((TPZFMatrix<long_double> *)
                          CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                          (int64_t)in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffbdc = SUB104(*plVar4,0);
      in_stack_fffffffffffffbe0 = (undefined6)((unkuint10)*plVar4 >> 0x20);
      plVar4 = TPZFMatrix<long_double>::operator()
                         ((TPZFMatrix<long_double> *)
                          CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                          (int64_t)in_stack_fffffffffffffbd0);
      *plVar4 = *plVar4 + (longdouble)CONCAT64(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    }
  }
  this_01 = (TPZStack<double,_10> *)TPZSimpleTimer::ReturnTimeDouble(in_stack_fffffffffffffbd0);
  TPZStack<double,_10>::Push(this_01,in_stack_fffffffffffffbc8);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f83b9e);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x1f83bab);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_fffffffffffffec0);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}